

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

int32 __thiscall StackSym::GetIntConstValue(StackSym *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntConstOpnd *this_00;
  AddrOpnd *pAVar4;
  RegOpnd *pRVar5;
  double value_00;
  int32 local_3c;
  bool isInt32;
  Var pvStack_38;
  int32 value;
  Var var;
  AddrOpnd *addr;
  Opnd *src1;
  Instr *defInstr;
  StackSym *this_local;
  
  defInstr = (Instr *)this;
  bVar2 = IsIntConst(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x245,"(this->IsIntConst())","this->IsIntConst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  src1 = (Opnd *)(this->field_5).m_instrDef;
  addr = (AddrOpnd *)IR::Instr::GetSrc1((Instr *)src1);
  bVar2 = IR::Opnd::IsIntConstOpnd((Opnd *)addr);
  if (bVar2) {
    if (((*(short *)&src1[3]._vptr_Opnd != 0x1e4) && (*(short *)&src1[3]._vptr_Opnd != 0x1e5)) &&
       (*(short *)&src1[3]._vptr_Opnd != 0x1ee)) {
      bVar2 = LowererMD::IsAssign((Instr *)src1);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                           ,0x24b,
                           "(defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr))"
                           ,
                           "defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
    this_00 = IR::Opnd::AsIntConstOpnd(&addr->super_Opnd);
    this_local._4_4_ = IR::IntConstOpnd::AsInt32(this_00);
  }
  else {
    bVar2 = IR::Opnd::IsAddrOpnd(&addr->super_Opnd);
    if (bVar2) {
      if (*(short *)&src1[3]._vptr_Opnd != 0x45) {
        bVar2 = LowererMD::IsAssign((Instr *)src1);
        if (((!bVar2) && (*(short *)&src1[3]._vptr_Opnd != 0x59)) &&
           (*(short *)&src1[3]._vptr_Opnd != 0x1ee)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                             ,0x251,
                             "(defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn)"
                             ,
                             "defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
      }
      var = IR::Opnd::AsAddrOpnd(&addr->super_Opnd);
      bVar2 = IR::AddrOpnd::IsVar((AddrOpnd *)var);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                           ,0x253,"(addr->IsVar())","addr->IsVar()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pAVar4 = IR::Opnd::AsAddrOpnd(&addr->super_Opnd);
      pvStack_38 = pAVar4->m_address;
      bVar2 = Js::TaggedInt::Is(pvStack_38);
      if (bVar2) {
        this_local._4_4_ = Js::TaggedInt::ToInt32(pvStack_38);
      }
      else {
        local_3c = -0x33333334;
        value_00 = Js::JavascriptNumber::GetValue(pvStack_38);
        bVar2 = Js::JavascriptNumber::TryGetInt32Value<false>(value_00,&local_3c);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                             ,0x25b,"(isInt32)","isInt32");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        this_local._4_4_ = local_3c;
      }
    }
    else {
      bVar2 = IR::Opnd::IsRegOpnd(&addr->super_Opnd);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                           ,0x25e,"(src1->IsRegOpnd())","src1->IsRegOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pRVar5 = IR::Opnd::AsRegOpnd(&addr->super_Opnd);
      this_local._4_4_ = GetIntConstValue(pRVar5->m_sym);
    }
  }
  return this_local._4_4_;
}

Assistant:

int32
StackSym::GetIntConstValue() const
{
    Assert(this->IsIntConst());
    IR::Instr *defInstr = this->m_instrDef;
    IR::Opnd *src1 = defInstr->GetSrc1();

    if (src1->IsIntConstOpnd())
    {
        Assert(defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr));
        return src1->AsIntConstOpnd()->AsInt32();
    }

    if (src1->IsAddrOpnd())
    {
        Assert(defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn);
        IR::AddrOpnd *addr = src1->AsAddrOpnd();
        Assert(addr->IsVar());
        Js::Var var = src1->AsAddrOpnd()->m_address;
        if (Js::TaggedInt::Is(var))
        {
            return Js::TaggedInt::ToInt32(var);
        }
        int32 value = 0xCCCCCCCC;
        const bool isInt32 = Js::JavascriptNumber::TryGetInt32Value(Js::JavascriptNumber::GetValue(var), &value);
        Assert(isInt32);
        return value;
    }
    Assert(src1->IsRegOpnd());
    return src1->AsRegOpnd()->m_sym->GetIntConstValue();
}